

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_mstring_get_mbs_l
                  (archive_mstring *aes,char **p,size_t *length,archive_string_conv *sc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int *piVar3;
  size_t sVar4;
  long lStack_30;
  
  wVar1 = aes->aes_set;
  wVar2 = L'\0';
  if ((wVar1 & 5U) == 4) {
    (aes->aes_mbs).length = 0;
    wVar1 = archive_string_append_from_wcs(&aes->aes_mbs,(aes->aes_wcs).s,(aes->aes_wcs).length);
    if (wVar1 == L'\0') {
      wVar1 = aes->aes_set | 1;
      aes->aes_set = wVar1;
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        return L'\xffffffff';
      }
      wVar1 = aes->aes_set;
      wVar2 = L'\xffffffff';
    }
  }
  if ((wVar1 & 1U) == 0) {
    *p = (char *)0x0;
    if (length == (size_t *)0x0) {
      return wVar2;
    }
    sVar4 = 0;
  }
  else {
    if (sc == (archive_string_conv *)0x0) {
      *p = (aes->aes_mbs).s;
      wVar2 = L'\0';
      if (length == (size_t *)0x0) {
        return L'\0';
      }
      lStack_30 = 8;
    }
    else {
      wVar2 = archive_strncpy_l(&aes->aes_mbs_in_locale,(aes->aes_mbs).s,(aes->aes_mbs).length,sc);
      *p = (aes->aes_mbs_in_locale).s;
      if (length == (size_t *)0x0) {
        return wVar2;
      }
      lStack_30 = 0x50;
    }
    sVar4 = *(size_t *)((long)&(aes->aes_mbs).s + lStack_30);
  }
  *length = sVar4;
  return wVar2;
}

Assistant:

int
archive_mstring_get_mbs_l(struct archive_mstring *aes,
    const char **p, size_t *length, struct archive_string_conv *sc)
{
	int r, ret = 0;

#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * Internationalization programming on Windows must use Wide
	 * characters because Windows platform cannot make locale UTF-8.
	 */
	if (sc != NULL && (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs_in_locale));
		r = archive_string_append_from_wcs_in_codepage(
		    &(aes->aes_mbs_in_locale), aes->aes_wcs.s,
		    aes->aes_wcs.length, sc);
		if (r == 0) {
			*p = aes->aes_mbs_in_locale.s;
			if (length != NULL)
				*length = aes->aes_mbs_in_locale.length;
			return (0);
		} else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
#endif

	/* If there is not an MBS form but is a WCS form, try converting
	 * with the native locale to be used for translating it to specified
	 * character-set. */
	if ((aes->aes_set & AES_SET_MBS) == 0 &&
	    (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		if (r == 0)
			aes->aes_set |= AES_SET_MBS;
		else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
	/* If we already have an MBS form, use it to be translated to
	 * specified character-set. */
	if (aes->aes_set & AES_SET_MBS) {
		if (sc == NULL) {
			/* Conversion is unneeded. */
			*p = aes->aes_mbs.s;
			if (length != NULL)
				*length = aes->aes_mbs.length;
			return (0);
		}
		ret = archive_strncpy_l(&(aes->aes_mbs_in_locale),
		    aes->aes_mbs.s, aes->aes_mbs.length, sc);
		*p = aes->aes_mbs_in_locale.s;
		if (length != NULL)
			*length = aes->aes_mbs_in_locale.length;
	} else {
		*p = NULL;
		if (length != NULL)
			*length = 0;
	}
	return (ret);
}